

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_null_as_real(void)

{
  error_code *error_00;
  error_code eVar1;
  int local_170 [2];
  error_category *local_168;
  longdouble local_158;
  undefined1 local_148 [32];
  undefined1 local_128 [8];
  error_code error_2;
  variable data_2;
  undefined8 local_d0;
  type_conflict9 local_c8 [2];
  undefined1 local_b8 [8];
  error_code error_1;
  variable data_1;
  undefined4 local_54;
  type_conflict8 local_50 [2];
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  std::error_code::error_code((error_code *)local_48);
  local_50[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)&error._M_cat,
                           (error_code *)local_48);
  local_54 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>(error)","0.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x148e,"void value_suite::fail_null_as_real()",local_50,&local_54);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  data_1.storage._40_4_ = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x148f,"void value_suite::fail_null_as_real()",local_48,&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  std::error_code::error_code((error_code *)local_b8);
  local_c8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                          ((basic_variable<std::allocator<char>_> *)&error_1._M_cat,
                           (error_code *)local_b8);
  local_d0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>(error)","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1494,"void value_suite::fail_null_as_real()",local_c8,&local_d0);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  data_2.storage._40_4_ = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1495,"void value_suite::fail_null_as_real()",local_b8,&data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat);
  std::error_code::error_code((error_code *)local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)&error_2._M_cat,(basic_variable<std::allocator<char>_> *)local_128,
             error_00);
  local_158 = (longdouble)0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>(error)","0.0L",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x149a,"void value_suite::fail_null_as_real()",local_148,&local_158);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  local_168 = eVar1._M_cat;
  local_170[0] = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x149b,"void value_suite::fail_null_as_real()",local_128,local_170);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat);
  return;
}

Assistant:

void fail_null_as_real()
{
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(error), 0.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(error), 0.0);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(error), 0.0L);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
}